

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageFuel.cpp
# Opt level: O2

bool __thiscall DIS::StorageFuel::operator==(StorageFuel *this,StorageFuel *rhs)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [12];
  unkbyte10 Var11;
  undefined4 in_ECX;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar16 [16];
  undefined1 auVar24 [16];
  undefined1 auVar17 [16];
  undefined1 auVar25 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar26 [16];
  undefined1 auVar14 [12];
  undefined1 auVar20 [16];
  undefined1 auVar15 [13];
  undefined1 auVar21 [16];
  undefined1 auVar27 [16];
  undefined1 auVar23 [16];
  undefined1 auVar22 [16];
  undefined2 uVar28;
  
  uVar1 = this->_fuelMeasurementUnits;
  uVar3 = this->_fuelType;
  uVar5 = this->_fuelLocation;
  uVar7 = this->_padding;
  uVar2 = rhs->_fuelMeasurementUnits;
  uVar4 = rhs->_fuelType;
  uVar6 = rhs->_fuelLocation;
  uVar8 = rhs->_padding;
  auVar18._0_9_ = CONCAT18(0xff,0xff00000000000000);
  auVar13._0_10_ = CONCAT19(0xff,auVar18._0_9_);
  auVar13[10] = 0xff;
  auVar14[0xb] = 0xff;
  auVar14._0_11_ = auVar13;
  auVar15[0xc] = 0xff;
  auVar15._0_12_ = auVar14;
  auVar23[0xd] = 0xff;
  auVar23._0_13_ = auVar15;
  auVar23[0xe] = 0xff;
  auVar23[0xf] = 0xff;
  auVar22._14_2_ = auVar23._14_2_;
  auVar22[0xd] = 0xff;
  auVar22._0_13_ = auVar15;
  auVar21._13_3_ = auVar22._13_3_;
  auVar21[0xc] = 0xff;
  auVar21._0_12_ = auVar14;
  auVar20._12_4_ = auVar21._12_4_;
  auVar20[0xb] = 0xff;
  auVar20._0_11_ = auVar13;
  auVar19._11_5_ = auVar20._11_5_;
  auVar19[10] = 0xff;
  auVar19._0_10_ = auVar13._0_10_;
  auVar18._10_6_ = auVar19._10_6_;
  auVar18[9] = 0xff;
  auVar17._9_7_ = auVar18._9_7_;
  auVar17[8] = 0xff;
  auVar17._0_8_ = 0xff00000000000000;
  Var11 = CONCAT91(CONCAT81(auVar17._8_8_,-(uVar8 == uVar7)),-(uVar8 == uVar7));
  auVar10._2_10_ = Var11;
  auVar10[1] = -(uVar6 == uVar5);
  auVar10[0] = -(uVar6 == uVar5);
  auVar9._2_12_ = auVar10;
  auVar9[1] = -(uVar4 == uVar3);
  auVar9[0] = -(uVar4 == uVar3);
  auVar16._0_2_ = CONCAT11(-(uVar2 == uVar1),-(uVar2 == uVar1));
  auVar16._2_14_ = auVar9;
  uVar28 = (undefined2)Var11;
  auVar27._0_12_ = auVar16._0_12_;
  auVar27._12_2_ = uVar28;
  auVar27._14_2_ = uVar28;
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = auVar16._0_10_;
  auVar26._10_2_ = auVar10._0_2_;
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = auVar16._0_8_;
  auVar25._8_2_ = auVar10._0_2_;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._6_2_ = auVar9._0_2_;
  auVar24._4_2_ = auVar9._0_2_;
  auVar24._2_2_ = auVar16._0_2_;
  auVar24._0_2_ = auVar16._0_2_;
  iVar12 = movmskps(in_ECX,auVar24);
  return iVar12 == 0xf && rhs->_fuelQuantity == this->_fuelQuantity;
}

Assistant:

bool StorageFuel::operator ==(const StorageFuel& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_fuelQuantity == rhs._fuelQuantity) ) ivarsEqual = false;
     if( ! (_fuelMeasurementUnits == rhs._fuelMeasurementUnits) ) ivarsEqual = false;
     if( ! (_fuelType == rhs._fuelType) ) ivarsEqual = false;
     if( ! (_fuelLocation == rhs._fuelLocation) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }